

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_general.h
# Opt level: O2

void mp::VisitArguments<mp::AlgebraicExpression<mp::LinTerms>>
               (ComplementarityConstraint<mp::AlgebraicExpression<mp::LinTerms>_> *cc,
               function<void_(int)> *argv)

{
  function<void_(int)> fStack_38;
  
  std::function<void_(int)>::operator()(argv,cc->compl_var_);
  std::function<void_(int)>::function(&fStack_38,argv);
  VisitArguments<mp::AlgebraicExpression<mp::LinTerms>>(&cc->compl_expr_,&fStack_38);
  std::_Function_base::~_Function_base(&fStack_38.super__Function_base);
  return;
}

Assistant:

inline void VisitArguments(const ComplementarityConstraint<Expr>& cc,
                           std::function<void (int) > argv) {
  argv(cc.GetVariable());
  VisitArguments(cc.GetExpression(), argv);
}